

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonengine.cpp
# Opt level: O0

void __thiscall banksia::JsonEngine::JsonEngine(JsonEngine *this,Config *config)

{
  long in_RSI;
  WbEngine *in_RDI;
  Config *in_stack_ffffffffffffffd8;
  UciEngine *in_stack_ffffffffffffffe0;
  
  Engine::Engine((Engine *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined ***)&(in_RDI->super_EngineProfile).super_Engine = &PTR__JsonEngine_00258720;
  *(undefined ***)((long)&(in_RDI->super_EngineProfile).super_Engine + 8) =
       &PTR__JsonEngine_00258848;
  *(undefined4 *)&(in_RDI->super_EngineProfile).profile.cpuTotal = 0;
  std::function<void_(banksia::Config_*)>::function
            ((function<void_(banksia::Config_*)> *)in_RDI,
             &(in_RDI->super_EngineProfile).profile.cpuTime);
  *(undefined4 *)&(in_RDI->super_EngineProfile).profile.memCall = 0x18;
  *(undefined4 *)((long)&(in_RDI->super_EngineProfile).profile.memCall + 4) = 0x32;
  *(undefined4 *)&(in_RDI->super_EngineProfile).profile.threadTotal = 0;
  *(undefined4 *)((long)&(in_RDI->super_EngineProfile).profile.threadTotal + 4) = 3;
  (in_RDI->super_EngineProfile).profile.threadCall = 0;
  UciEngine::UciEngine(in_stack_ffffffffffffffe0);
  WbEngine::WbEngine(in_RDI);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1db1f9);
  *(undefined4 *)((long)&(in_RDI->super_EngineProfile).profile.cpuTotal + 4) =
       *(undefined4 *)(in_RSI + 8);
  if (*(int *)(in_RSI + 8) == 2) {
    (in_RDI->super_EngineProfile).super_Engine.config.protocol = uci;
  }
  return;
}

Assistant:

JsonEngine::JsonEngine(const Config& config)
: Engine(config)
{
    assert(!config.command.empty());
    
    originalProtocol = config.protocol;
    if (config.protocol == Protocol::none) {
        this->config.protocol = Protocol::uci;
    }
}